

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

void MNS::Server::onSecondTimer(uv_timer_t *handle)

{
  tm *__tp;
  time_t t;
  char strt [100];
  time_t local_80;
  char local_78 [120];
  
  local_80 = time((time_t *)0x0);
  __tp = gmtime(&local_80);
  strftime(local_78,100,"%a, %e %b %Y %H:%M:%S GMT",__tp);
  std::__cxx11::string::operator=((string *)currTime_abi_cxx11_,local_78);
  return;
}

Assistant:

void MNS::Server::onSecondTimer(uv_timer_t *handle) {
	char strt[100];
	std::time_t t = std::time(NULL);
	std::strftime(strt, 100, "%a, %e %b %Y %H:%M:%S GMT\0", std::gmtime(&t));

	MNS::Server::currTime = strt;
}